

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QRect __thiscall QWidget::childrenRect(QWidget *this)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  QWidgetPrivate *pQVar4;
  qsizetype qVar5;
  QWidget *this_00;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  QWidgetPrivate *d;
  QRect r;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  QRect *in_stack_ffffffffffffffb8;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QWidget *)0x369eb5);
  QRect::QRect(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  local_2c = 0;
  while( true ) {
    qVar5 = QList<QObject_*>::size((QList<QObject_*> *)&pQVar4->field_0x18);
    if (qVar5 <= local_2c) break;
    QList<QObject_*>::at
              ((QList<QObject_*> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    this_00 = qobject_cast<QWidget*>
                        ((QObject *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (this_00 != (QWidget *)0x0) {
      bVar3 = isWindow((QWidget *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (!bVar3) {
        bVar3 = isHidden((QWidget *)0x369f55);
        if (!bVar3) {
          geometry(this_00);
          QRect::operator|=(in_stack_ffffffffffffffb8,
                            (QRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        }
      }
    }
    local_2c = local_2c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVar2._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QWidget::childrenRect() const
{
    Q_D(const QWidget);
    QRect r(0, 0, 0, 0);
    for (int i = 0; i < d->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
        if (w && !w->isWindow() && !w->isHidden())
            r |= w->geometry();
    }
    return r;
}